

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O1

int ffgtcpr(fitsfile *infptr,fitsfile *outfptr,int cpopt,HDUtracker *HDU,int *status)

{
  int iVar1;
  long lVar2;
  fitsfile *mfptr;
  int newPosition;
  int startSearch;
  int keypos;
  int groupHDUnum;
  long nmembers;
  int numkeys;
  int hdutype;
  long newTfields;
  char *tkeyvalue;
  long tfields;
  char *includeList [1];
  char keyvalue [71];
  char card [81];
  char *excludeList [8];
  char comment [81];
  char keyword [75];
  fitsfile *local_220;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  long local_208;
  int local_200 [2];
  long local_1f8;
  char *local_1f0;
  long local_1e8;
  char *local_1e0;
  char local_1d8 [80];
  int local_188;
  char local_184;
  undefined1 local_17f;
  char *local_128;
  char *pcStack_120;
  char *local_118;
  char *pcStack_110;
  char *local_108;
  char *pcStack_100;
  char *local_f8;
  char *pcStack_f0;
  char local_e8 [96];
  char local_88 [88];
  
  local_200[1] = 0;
  local_20c = 0;
  local_200[0] = 0;
  local_210 = 0;
  local_214 = 0;
  local_218 = 0;
  local_208 = 0;
  local_1e8 = 0;
  local_1f8 = 0;
  local_1e0 = "*";
  local_f8 = "TDIM#";
  pcStack_f0 = "T????#";
  local_108 = "GRPLC#";
  pcStack_100 = "THEAP";
  local_118 = "GRPNAME";
  pcStack_110 = "GRPID#";
  local_128 = "EXTNAME";
  pcStack_120 = "EXTVER";
  local_220 = (fitsfile *)0x0;
  iVar1 = *status;
  if (iVar1 == 0) {
    iVar1 = ffgtnm(infptr,&local_208,status);
    *status = iVar1;
    iVar1 = ffgkys(infptr,"GRPNAME",local_1d8,(char *)&local_188,status);
    *status = iVar1;
    if (iVar1 == 0xca) {
      local_1d8[0] = '\0';
      *status = 0;
    }
    prepare_keyvalue(local_1d8);
    iVar1 = ffgtcr(outfptr,local_1d8,0,status);
    *status = iVar1;
    ffghdn(outfptr,&local_20c);
    iVar1 = fftsud(infptr,HDU,local_20c,(char *)0x0);
    *status = iVar1;
    if (cpopt == 0) {
      if (0 < local_208) {
        lVar2 = 0;
        do {
          if (*status != 0) break;
          lVar2 = lVar2 + 1;
          iVar1 = ffgmop(infptr,lVar2,&local_220,status);
          *status = iVar1;
          iVar1 = ffgtam(outfptr,local_220,0,status);
          *status = iVar1;
          ffclos(local_220,status);
          local_220 = (fitsfile *)0x0;
        } while (lVar2 < local_208);
      }
    }
    else if (cpopt == 2) {
      if (0 < local_208) {
        lVar2 = 0;
        do {
          if (*status != 0) break;
          lVar2 = lVar2 + 1;
          iVar1 = ffgmop(infptr,lVar2,&local_220,status);
          *status = iVar1;
          if (iVar1 == 0) {
            iVar1 = fftsad(local_220,HDU,&local_218,(char *)0x0);
            *status = iVar1;
            if (iVar1 == 0) {
              iVar1 = ffgkys(local_220,"EXTNAME",local_1d8,(char *)&local_188,status);
              *status = iVar1;
              if (iVar1 == 0xca) {
                local_1d8[0] = '\0';
                *status = 0;
              }
              prepare_keyvalue(local_1d8);
              iVar1 = fits_strcasecmp(local_1d8,"GROUPING");
              if (iVar1 == 0) {
                iVar1 = ffgtcpr(local_220,outfptr,2,HDU,status);
              }
              else {
                iVar1 = ffgmcp(infptr,outfptr,lVar2,1,status);
              }
              *status = iVar1;
              ffghdn(outfptr,&local_218);
              iVar1 = fits_strcasecmp(local_1d8,"GROUPING");
              if (iVar1 != 0) {
                iVar1 = fftsud(local_220,HDU,local_218,(char *)0x0);
                *status = iVar1;
              }
              iVar1 = ffmahd(outfptr,local_20c,local_200 + 1,status);
              *status = iVar1;
            }
            else {
              if (iVar1 != 0x15a) goto LAB_001b90d3;
              *status = 0;
            }
            iVar1 = ffgtam(outfptr,(fitsfile *)0x0,local_218,status);
            *status = iVar1;
            ffclos(local_220,status);
            local_220 = (fitsfile *)0x0;
          }
LAB_001b90d3:
        } while (lVar2 < local_208);
      }
    }
    else {
      *status = 0x15b;
      ffpmsg("Invalid value specified for cmopt parameter (ffgtcpr)");
    }
    if (*status == 0) {
      ffmahd(outfptr,local_20c,local_200 + 1,status);
      iVar1 = ffgcrd(outfptr,"TTYPE1",(char *)&local_188,status);
      *status = iVar1;
      iVar1 = ffghps(outfptr,local_200,&local_210,status);
      *status = iVar1;
      local_210 = local_210 + -1;
      local_214 = 8;
      while (*status == 0) {
        ffgrec(infptr,local_214,(char *)&local_188,status);
        iVar1 = ffgnxk(infptr,&local_1e0,1,&local_128,8,(char *)&local_188,status);
        *status = iVar1;
        iVar1 = ffghps(infptr,local_200,&local_214,status);
        *status = iVar1;
        local_214 = local_214 + -1;
        if (local_184 == 'C' && local_188 == 0x4c505247) {
          iVar1 = ffgrec(infptr,local_214,(char *)&local_188,status);
          *status = iVar1;
          local_17f = 0;
          iVar1 = ffgkls(infptr,(char *)&local_188,&local_1f0,local_e8,status);
          *status = iVar1;
          if (iVar1 == 0) {
            ffikls(outfptr,(char *)&local_188,local_1f0,local_e8,status);
            ffplsw(outfptr,status);
            free(local_1f0);
          }
        }
        else {
          iVar1 = ffirec(outfptr,local_210,(char *)&local_188,status);
          *status = iVar1;
        }
        local_210 = local_210 + 1;
      }
      if (*status == 0xca) {
        *status = 0;
        iVar1 = ffgkyj(infptr,"TFIELDS",&local_1e8,(char *)&local_188,status);
        *status = iVar1;
        iVar1 = ffgkyj(outfptr,"TFIELDS",&local_1f8,(char *)&local_188,status);
        *status = iVar1;
        if (0 < local_1e8) {
          lVar2 = 0;
          do {
            snprintf(local_88,0x4b,"TTYPE%d",(ulong)((int)lVar2 + 1));
            iVar1 = ffgkys(infptr,local_88,local_1d8,(char *)&local_188,status);
            *status = iVar1;
            if (iVar1 == 0xca) {
              *status = 0;
              local_1d8[0] = '\0';
            }
            prepare_keyvalue(local_1d8);
            iVar1 = fits_strcasecmp(local_1d8,"MEMBER_XTENSION");
            if ((((iVar1 != 0) && (iVar1 = fits_strcasecmp(local_1d8,"MEMBER_NAME"), iVar1 != 0)) &&
                (iVar1 = fits_strcasecmp(local_1d8,"MEMBER_VERSION"), iVar1 != 0)) &&
               (((iVar1 = fits_strcasecmp(local_1d8,"MEMBER_POSITION"), iVar1 != 0 &&
                 (iVar1 = fits_strcasecmp(local_1d8,"MEMBER_LOCATION"), iVar1 != 0)) &&
                (iVar1 = fits_strcasecmp(local_1d8,"MEMBER_URI_TYPE"), iVar1 != 0)))) {
              iVar1 = ffcpcl(infptr,outfptr,(int)lVar2 + 1,(int)local_1f8 + 1,1,status);
              *status = iVar1;
              local_1f8 = local_1f8 + 1;
            }
            lVar2 = lVar2 + 1;
          } while (lVar2 < local_1e8);
        }
      }
    }
    if (local_220 != (fitsfile *)0x0) {
      ffclos(local_220,status);
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgtcpr(fitsfile   *infptr,  /* input FITS file pointer                 */
	    fitsfile   *outfptr, /* output FITS file pointer                */
	    int         cpopt,   /* code specifying copy options:
				    OPT_GCP_GPT (0) ==> cp only grouping table
				    OPT_GCP_ALL (2) ==> recusrively copy 
				    members and their members (if groups)   */
	    HDUtracker *HDU,     /* list of already copied HDUs             */
	    int        *status)  /* return status code                      */

/*
  copy a Group to a new FITS file. If the cpopt parameter is set to 
  OPT_GCP_GPT (copy grouping table only) then the existing members have their 
  GRPIDn and GRPLCn keywords updated to reflect the existance of the new group,
  since they now belong to another group. If cpopt is set to OPT_GCP_ALL 
  (copy grouping table and members recursively) then the original members are 
  not updated; the new grouping table is modified to include only the copied 
  member HDUs and not the original members.

  Note that this function is recursive. When copt is OPT_GCP_ALL it will call
  itself whenever a member HDU of the current grouping table is itself a
  grouping table (i.e., EXTNAME = 'GROUPING').
*/

{

  int i;
  int nexclude     = 8;
  int hdutype      = 0;
  int groupHDUnum  = 0;
  int numkeys      = 0;
  int keypos       = 0;
  int startSearch  = 0;
  int newPosition  = 0;

  long nmembers    = 0;
  long tfields     = 0;
  long newTfields  = 0;

  char keyword[FLEN_KEYWORD];
  char keyvalue[FLEN_VALUE];
  char card[FLEN_CARD];
  char comment[FLEN_CARD];
  char *tkeyvalue;

  char *includeList[] = {"*"};
  char *excludeList[] = {"EXTNAME","EXTVER","GRPNAME","GRPID#","GRPLC#",
			 "THEAP","TDIM#","T????#"};

  fitsfile *mfptr = NULL;


  if(*status != 0) return(*status);

  do
    {
      /*
	create a new grouping table in the FITS file pointed to by outptr
      */

      *status = fits_get_num_members(infptr,&nmembers,status);

      *status = fits_read_key_str(infptr,"GRPNAME",keyvalue,card,status);

      if(*status == KEY_NO_EXIST)
	{
	  keyvalue[0] = 0;
	  *status     = 0;
	}
      prepare_keyvalue(keyvalue);

      *status = fits_create_group(outfptr,keyvalue,GT_ID_ALL_URI,status);
     
      /* save the new grouping table's HDU position for future use */

      fits_get_hdu_num(outfptr,&groupHDUnum);

      /* update the HDUtracker struct with the grouping table's new position */
      
      *status = fftsud(infptr,HDU,groupHDUnum,NULL);

      /*
	Now populate the copied grouping table depending upon the 
	copy option parameter value
      */

      switch(cpopt)
	{

	  /*
	    for the "copy grouping table only" option we only have to
	    add the members of the original grouping table to the new
	    grouping table
	  */

	case OPT_GCP_GPT:

	  for(i = 1; i <= nmembers && *status == 0; ++i)
	    {
	      *status = fits_open_member(infptr,i,&mfptr,status);
	      *status = fits_add_group_member(outfptr,mfptr,0,status);

	      fits_close_file(mfptr,status);
	      mfptr = NULL;
	    }

	  break;

	case OPT_GCP_ALL:
      
	  /*
	    for the "copy the entire group" option
 	  */

	  /* loop over all the grouping table members */

	  for(i = 1; i <= nmembers && *status == 0; ++i)
	    {
	      /* open the ith member */

	      *status = fits_open_member(infptr,i,&mfptr,status);

	      if(*status != 0) continue;

	      /* add it to the HDUtracker struct */

	      *status = fftsad(mfptr,HDU,&newPosition,NULL);

	      /* if already copied then just add the member to the group */

	      if(*status == HDU_ALREADY_TRACKED)
		{
		  *status = 0;
		  *status = fits_add_group_member(outfptr,NULL,newPosition,
						  status);
		  fits_close_file(mfptr,status);
                  mfptr = NULL;
		  continue;
		}
	      else if(*status != 0) continue;

	      /* see if the member is a grouping table */

	      *status = fits_read_key_str(mfptr,"EXTNAME",keyvalue,card,
					  status);

	      if(*status == KEY_NO_EXIST)
		{
		  keyvalue[0] = 0;
		  *status     = 0;
		}
	      prepare_keyvalue(keyvalue);

	      /*
		if the member is a grouping table then copy it and all of
		its members using ffgtcpr(), else copy it using
		fits_copy_member(); the outptr will point to the newly
		copied member upon return from both functions
	      */

	      if(fits_strcasecmp(keyvalue,"GROUPING") == 0)
		*status = ffgtcpr(mfptr,outfptr,OPT_GCP_ALL,HDU,status);
	      else
		*status = fits_copy_member(infptr,outfptr,i,OPT_MCP_NADD,
					   status);

	      /* retrieve the position of the newly copied member */

	      fits_get_hdu_num(outfptr,&newPosition);

	      /* update the HDUtracker struct with member's new position */
	      
	      if(fits_strcasecmp(keyvalue,"GROUPING") != 0)
		*status = fftsud(mfptr,HDU,newPosition,NULL);

	      /* move the outfptr back to the copied grouping table HDU */

	      *status = fits_movabs_hdu(outfptr,groupHDUnum,&hdutype,status);

	      /* add the copied member HDU to the copied grouping table */

	      *status = fits_add_group_member(outfptr,NULL,newPosition,status);

	      /* close the mfptr pointer */

	      fits_close_file(mfptr,status);
	      mfptr = NULL;
	    }

	  break;

	default:
	  
	  *status = BAD_OPTION;
	  ffpmsg("Invalid value specified for cmopt parameter (ffgtcpr)");
	  break;
	}

      if(*status != 0) continue; 

      /* 
	 reposition the outfptr to the grouping table so that the grouping
	 table is the CHDU upon return to the calling function
      */

      fits_movabs_hdu(outfptr,groupHDUnum,&hdutype,status);

      /*
	 copy all auxiliary keyword records from the original grouping table
	 to the new grouping table; they are copied in their original order
	 and inserted just before the TTYPE1 keyword record
      */

      *status = fits_read_card(outfptr,"TTYPE1",card,status);
      *status = fits_get_hdrpos(outfptr,&numkeys,&keypos,status);
      --keypos;

      startSearch = 8;

      while(*status == 0)
	{
	  ffgrec(infptr,startSearch,card,status);

	  *status = fits_find_nextkey(infptr,includeList,1,excludeList,
				      nexclude,card,status);

	  *status = fits_get_hdrpos(infptr,&numkeys,&startSearch,status);

	  --startSearch;
	  /* SPR 1738 */
	  if (strncmp(card,"GRPLC",5)) {
	    /* Not going to be a long string so we're ok */
	    *status = fits_insert_record(outfptr,keypos,card,status);
	  } else {
	    /* We could have a long string */
	    *status = fits_read_record(infptr,startSearch,card,status);
	    card[9] = '\0';
	    *status = fits_read_key_longstr(infptr,card,&tkeyvalue,comment,
					    status);
	    if (0 == *status) {
	      fits_insert_key_longstr(outfptr,card,tkeyvalue,comment,status);
	      fits_write_key_longwarn(outfptr,status);
	      free(tkeyvalue);
	    }
	  }
	  
	  ++keypos;
	}
      
	  
      if(*status == KEY_NO_EXIST) 
	*status = 0;
      else if(*status != 0) continue;

      /*
	 search all the columns of the original grouping table and copy
	 those to the new grouping table that were not part of the grouping
	 convention. Note that is legal to have additional columns in a
	 grouping table. Also note that the order of the columns may
	 not be the same in the original and copied grouping table.
      */

      /* retrieve the number of columns in the original and new group tables */

      *status = fits_read_key_lng(infptr,"TFIELDS",&tfields,card,status);
      *status = fits_read_key_lng(outfptr,"TFIELDS",&newTfields,card,status);

      for(i = 1; i <= tfields; ++i)
	{
	  snprintf(keyword,FLEN_KEYWORD,"TTYPE%d",i);
	  *status = fits_read_key_str(infptr,keyword,keyvalue,card,status);
	  
	  if(*status == KEY_NO_EXIST)
	    {
	      *status = 0;
              keyvalue[0] = 0;
	    }
	  prepare_keyvalue(keyvalue);

	  if(fits_strcasecmp(keyvalue,"MEMBER_XTENSION") != 0 &&
	     fits_strcasecmp(keyvalue,"MEMBER_NAME")     != 0 &&
	     fits_strcasecmp(keyvalue,"MEMBER_VERSION")  != 0 &&
	     fits_strcasecmp(keyvalue,"MEMBER_POSITION") != 0 &&
	     fits_strcasecmp(keyvalue,"MEMBER_LOCATION") != 0 &&
	     fits_strcasecmp(keyvalue,"MEMBER_URI_TYPE") != 0   )
	    {
 
	      /* SPR 3956, add at the end of the table */
	      *status = fits_copy_col(infptr,outfptr,i,newTfields+1,1,status);
	      ++newTfields;
	    }
	}

    }while(0);

  if(mfptr != NULL) 
    {
      fits_close_file(mfptr,status);
    }

  return(*status);
}